

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O1

void Gia_ManIncrSimStop(Gia_Man_t *p)

{
  int *__ptr;
  word *__ptr_00;
  
  if (p->fIncrSim != 0) {
    p->fIncrSim = 0;
    p->iPatsPi = 0;
    p->nSimWords = 0;
    p->iTimeStamp = 1;
    if (p->vTimeStamps != (Vec_Int_t *)0x0) {
      __ptr = p->vTimeStamps->pArray;
      if (__ptr != (int *)0x0) {
        free(__ptr);
        p->vTimeStamps->pArray = (int *)0x0;
      }
      if (p->vTimeStamps != (Vec_Int_t *)0x0) {
        free(p->vTimeStamps);
        p->vTimeStamps = (Vec_Int_t *)0x0;
      }
    }
    if (p->vSims != (Vec_Wrd_t *)0x0) {
      __ptr_00 = p->vSims->pArray;
      if (__ptr_00 != (word *)0x0) {
        free(__ptr_00);
        p->vSims->pArray = (word *)0x0;
      }
      if (p->vSims != (Vec_Wrd_t *)0x0) {
        free(p->vSims);
        p->vSims = (Vec_Wrd_t *)0x0;
      }
    }
    return;
  }
  __assert_fail("p->fIncrSim",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSim.c"
                ,0x48e,"void Gia_ManIncrSimStop(Gia_Man_t *)");
}

Assistant:

void Gia_ManIncrSimStop( Gia_Man_t * p )
{
    assert( p->fIncrSim );
    p->fIncrSim   = 0;
    p->iPatsPi    = 0;
    p->nSimWords  = 0;
    p->iTimeStamp = 1;
    Vec_IntFreeP( &p->vTimeStamps );
    Vec_WrdFreeP( &p->vSims );
}